

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r4.h
# Opt level: O1

int graph_5_4::dfs(m_graph g,int v)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  code *pcVar6;
  ulong uVar7;
  m_graph *pmVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  code *pcVar11;
  byte bVar12;
  m_graph in_stack_fffffffffffffc70;
  m_graph in_stack_fffffffffffffe38;
  int iStack_8;
  
  bVar12 = 0;
  piVar4 = &visited;
  (&visited)[v] = 1;
  iVar3 = 0;
  do {
    iVar2 = iVar3;
    iVar1 = *piVar4;
    piVar4 = piVar4 + 1;
    iVar3 = iVar2 + 1;
  } while (iVar1 != 0);
  pmVar8 = &g;
  puVar9 = (undefined8 *)&stack0xfffffffffffffe38;
  for (lVar5 = 0x38; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar9 = *(undefined8 *)pmVar8->arc[0];
    pmVar8 = (m_graph *)(pmVar8->arc[0] + 2);
    puVar9 = puVar9 + 1;
  }
  dfs(in_stack_fffffffffffffe38,iVar2);
  if (0 < (long)iStack_8) {
    memset(&visited,0,(long)iStack_8 << 2);
  }
  piVar4 = &visited;
  iVar3 = 0;
  do {
    iVar2 = iVar3;
    iVar1 = *piVar4;
    piVar4 = piVar4 + 1;
    iVar3 = iVar2 + 1;
  } while (iVar1 != 0);
  puVar9 = (undefined8 *)&stack0xfffffffffffffe40;
  puVar10 = (undefined8 *)&stack0xfffffffffffffc70;
  for (lVar5 = 0x38; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar10 = *puVar9;
    puVar9 = puVar9 + (ulong)bVar12 * -2 + 1;
    puVar10 = puVar10 + (ulong)bVar12 * -2 + 1;
  }
  dfs(in_stack_fffffffffffffc70,iVar2);
  memcpy(&stack0xffffffffffbf106c,&stack0xfffffffffffffc7c,0x40ebd4);
  do {
    uVar7 = 0;
    iVar3 = -1;
    pcVar6 = (code *)0x1;
    do {
      iVar1 = *(int *)(&stack0xffffffffffbf1068 + (long)pcVar6 * 4);
      if (iVar1 != 0 && iVar1 < iVar3) {
        iVar3 = iVar1;
        uVar7 = (ulong)pcVar6 & 0xffffffff;
      }
      *(undefined4 *)(&stack0xffffffffffbf1068 + (long)(int)uVar7 * 4) = 0;
      pcVar11 = (code *)0x1;
      do {
        if ((*(int *)(&stack0xffffffffffbf1068 + (long)pcVar11 * 4) != 0) &&
           (*(int *)(&stack0xfffffffffffffc78 + (long)pcVar11 * 4 + (long)(int)uVar7 * 0x28) <
            *(int *)(&stack0xffffffffffbf1068 + (long)pcVar11 * 4))) {
          *(int *)(&stack0xffffffffffbf1068 + (long)pcVar11 * 4) =
               *(int *)(&stack0xfffffffffffffc78 + (long)pcVar11 * 4 + (long)(int)uVar7 * 0x28);
        }
        pcVar11 = pcVar11 + 1;
      } while (pcVar11 != dfs_traverse);
      pcVar6 = pcVar6 + 1;
    } while (pcVar6 != dfs_traverse);
  } while( true );
}

Assistant:

int dfs(m_graph g, int v) {
        visited[v] = 1;
//        visit
        for (int i = 0; i < g.vnum; i++)
            if (visited[i] == 0)
                dfs(g, i);
    }